

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_common.c
# Opt level: O0

void loop_filter_rows_mt(YV12_BUFFER_CONFIG *frame,AV1_COMMON *cm,MACROBLOCKD *xd,int start,int stop
                        ,int *planes_to_lf,AVxWorker *workers,int num_workers,AV1LfSync *lf_sync,
                        int lpf_opt_level)

{
  AVxWorkerHook p_Var1;
  int iVar2;
  AV1_COMMON *cm_00;
  long lVar3;
  MACROBLOCKD *in_RDX;
  AV1Common *in_RSI;
  YV12_BUFFER_CONFIG *in_RDI;
  int in_R8D;
  long in_stack_00000008;
  LFWorkerData *lf_data;
  AVxWorker *worker;
  int i;
  AVxWorkerInterface *winterface;
  int in_stack_00000174;
  AV1_COMMON *in_stack_00000178;
  AVxWorker *in_stack_00000180;
  undefined4 in_stack_ffffffffffffffb4;
  undefined8 in_stack_ffffffffffffffb8;
  int *in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  
  iVar2 = (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  cm_00 = (AV1_COMMON *)aom_get_worker_interface();
  loop_filter_frame_mt_init
            (cm_00,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
             iVar2,(AV1LfSync *)CONCAT44(in_stack_ffffffffffffffb4,5),in_R8D,(int)in_RDX);
  for (iVar2 = (int)lf_data + -1; -1 < iVar2; iVar2 = iVar2 + -1) {
    lVar3 = in_stack_00000008 + (long)iVar2 * 0x38;
    p_Var1 = worker[1].hook;
    *(code **)(lVar3 + 0x18) = loop_filter_row_worker;
    *(AVxWorker **)(lVar3 + 0x20) = worker;
    *(LFWorkerData **)(lVar3 + 0x28) = (LFWorkerData *)(p_Var1 + (long)iVar2 * 0x2268);
    loop_filter_data_reset((LFWorkerData *)(p_Var1 + (long)iVar2 * 0x2268),in_RDI,in_RSI,in_RDX);
    *(undefined4 *)(lVar3 + 0x30) = 0;
    if (iVar2 == 0) {
      (**(code **)&(cm_00->current_frame).skip_mode_info.ref_frame_idx_1)(lVar3);
    }
    else {
      (**(code **)&(cm_00->current_frame).skip_mode_info.skip_mode_flag)(lVar3);
    }
  }
  sync_lf_workers(in_stack_00000180,in_stack_00000178,in_stack_00000174);
  return;
}

Assistant:

static void loop_filter_rows_mt(YV12_BUFFER_CONFIG *frame, AV1_COMMON *cm,
                                MACROBLOCKD *xd, int start, int stop,
                                const int planes_to_lf[MAX_MB_PLANE],
                                AVxWorker *workers, int num_workers,
                                AV1LfSync *lf_sync, int lpf_opt_level) {
  const AVxWorkerInterface *const winterface = aom_get_worker_interface();
  int i;
  loop_filter_frame_mt_init(cm, start, stop, planes_to_lf, num_workers, lf_sync,
                            lpf_opt_level, MAX_MIB_SIZE_LOG2);

  // Set up loopfilter thread data.
  for (i = num_workers - 1; i >= 0; --i) {
    AVxWorker *const worker = &workers[i];
    LFWorkerData *const lf_data = &lf_sync->lfdata[i];

    worker->hook = loop_filter_row_worker;
    worker->data1 = lf_sync;
    worker->data2 = lf_data;

    // Loopfilter data
    loop_filter_data_reset(lf_data, frame, cm, xd);

    // Start loopfiltering
    worker->had_error = 0;
    if (i == 0) {
      winterface->execute(worker);
    } else {
      winterface->launch(worker);
    }
  }

  sync_lf_workers(workers, cm, num_workers);
}